

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall Shader::fragment(Shader *this,Model *model,vec3f bar,TGAColor *color)

{
  double dVar1;
  DepthBuffer *this_00;
  double __y;
  TGAColor TVar2;
  double *pdVar3;
  vec<3UL,_double> *pvVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  vec<2UL,_double> vVar7;
  double local_258;
  double local_250;
  int local_244;
  uint8_t auStack_23d [4];
  int i;
  double dStack_238;
  TGAColor c;
  double local_230;
  double local_228;
  double diff;
  double local_218;
  double spec;
  vec<3UL,_double> local_208;
  vec<3UL,_double> local_1f0;
  double dStack_1d8;
  vec3f r;
  vec<4UL,_double> local_1a0;
  vec<3UL,_double> local_180;
  undefined1 auStack_168 [8];
  vec3f l;
  vec3f local_148;
  vec<4UL,_double> local_130;
  vec<4UL,_double> local_110;
  vec<3UL,_double> local_f0;
  undefined1 auStack_d8 [8];
  vec3f n;
  undefined1 local_b8 [8];
  vec2f uv;
  double shadow;
  double dStack_98;
  double local_90;
  double dStack_88;
  vec<3UL,_double> local_80;
  vec<4UL,_double> local_68;
  undefined1 auStack_48 [8];
  vec4f sb_p;
  TGAColor *color_local;
  Model *model_local;
  Shader *this_local;
  
  operator*(&local_80,&this->varying_tri,&bar);
  embed<4ul,3ul,double>(&local_68,&local_80,1.0);
  operator*((vec<4UL,_double> *)auStack_48,&this->uniform_Mshadow,&local_68);
  pdVar3 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)auStack_48,3);
  operator/((vec<4UL,_double> *)&shadow,(vec<4UL,_double> *)auStack_48,pdVar3);
  sb_p.data[1] = local_90;
  sb_p.data[2] = dStack_88;
  auStack_48 = (undefined1  [8])shadow;
  sb_p.data[0] = dStack_98;
  this_00 = this->shadow_buffer;
  pdVar3 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)auStack_48,0);
  dVar1 = *pdVar3;
  pdVar3 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)auStack_48,1);
  dVar1 = DepthBuffer::get(this_00,(long)(int)dVar1,(long)(int)*pdVar3);
  pdVar3 = vec<4UL,_double>::operator[]((vec<4UL,_double> *)auStack_48,2);
  uv.y = *(double *)(&DAT_00110048 + (ulong)(dVar1 <= *pdVar3 + 43.34) * 8);
  vVar7 = operator*(&this->varying_uv,&bar);
  local_b8 = (undefined1  [8])vVar7.x;
  uv.x = vVar7.y;
  Model::normal(&local_148,model,(vec2f *)local_b8);
  pvVar4 = vec<3UL,_double>::normalize(&local_148);
  embed<4ul,3ul,double>(&local_130,pvVar4,1.0);
  operator*(&local_110,&this->uniform_MIT,&local_130);
  proj<3ul,4ul,double>(&local_f0,&local_110);
  pvVar4 = vec<3UL,_double>::normalize(&local_f0);
  n.y = pvVar4->z;
  auStack_d8 = (undefined1  [8])pvVar4->x;
  n.x = pvVar4->y;
  embed<4ul,3ul,double>((vec<4UL,_double> *)&r.z,&light_dir,1.0);
  operator*(&local_1a0,&this->uniform_M,(vec<4UL,_double> *)&r.z);
  proj<3ul,4ul,double>(&local_180,&local_1a0);
  pvVar4 = vec<3UL,_double>::normalize(&local_180);
  l.y = pvVar4->z;
  auStack_168 = (undefined1  [8])pvVar4->x;
  l.x = pvVar4->y;
  dVar1 = dot<3ul,double>((vec<3UL,_double> *)auStack_d8,(vec<3UL,_double> *)auStack_168);
  spec = dVar1 + dVar1;
  operator*(&local_208,(vec<3UL,_double> *)auStack_d8,&spec);
  operator-(&local_1f0,&local_208,(vec<3UL,_double> *)auStack_168);
  pvVar4 = vec<3UL,_double>::normalize(&local_1f0);
  r.y = pvVar4->z;
  dStack_1d8 = pvVar4->x;
  r.x = pvVar4->y;
  diff = 0.0;
  pdVar3 = std::max<double>(&r.y,&diff);
  dVar1 = *pdVar3;
  __y = Model::specular(model,(vec2f *)local_b8);
  local_218 = pow(dVar1,__y);
  local_230 = 0.0;
  dStack_238 = dot<3ul,double>((vec<3UL,_double> *)auStack_d8,(vec<3UL,_double> *)auStack_168);
  pdVar3 = std::max<double>(&local_230,&stack0xfffffffffffffdc8);
  local_228 = *pdVar3;
  TVar2 = Model::diffuse(model,(vec2f *)local_b8);
  auStack_23d = TVar2.bgra;
  i._3_1_ = TVar2.bytespp;
  for (local_244 = 0; local_244 < 3; local_244 = local_244 + 1) {
    pbVar5 = TGAColor::operator[]((TGAColor *)&stack0xfffffffffffffdc3,(long)local_244);
    local_250 = (double)*pbVar5 * uv.y * (local_228 * 1.2 + local_218 * 0.6) + 20.0;
    local_258 = 255.0;
    pdVar3 = std::min<double>(&local_250,&local_258);
    dVar1 = *pdVar3;
    puVar6 = TGAColor::operator[](color,(long)local_244);
    *puVar6 = (uint8_t)(int)dVar1;
  }
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec4f sb_p = uniform_Mshadow *
                     embed<4>(varying_tri * bar);  // corresponding point in the shadow buffer
        sb_p = sb_p / sb_p[3];
        double shadow = .3 + .7 * (shadow_buffer.get(int(sb_p[0]), int(sb_p[1])) <=
                                   sb_p[2] + 43.34);  // magic coeff to avoid z-fighting
        // shadow = std::max(0., shadow);

        // shadow = .7 * shadow_buffer.get(int(sb_p[0]), int(sb_p[1]));
        vec2f uv = varying_uv * bar;  // interpolate uv for the current pixel
        vec3f n =
            proj<3>(uniform_MIT * embed<4>(model.normal(uv).normalize())).normalize();  // normal
        vec3f l = proj<3>(uniform_M * embed<4>(light_dir)).normalize();  // light vector
        vec3f r = (n * (dot(n, l) * 2.) - l).normalize();                // reflected light
        double spec = std::pow(std::max(r.z, 0.0), model.specular(uv));
        double diff = std::max(0., dot(n, l));
        TGAColor c = model.diffuse(uv);
        for (int i = 0; i < 3; i++) {
            color[i] =
                static_cast<uint8_t>(std::min(20 + c[i] * shadow * (1.2 * diff + .6 * spec), 255.));
            // color[i] = (uint8_t)(model.specular(uv) + 64);
        }

        return false;
    }